

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpserver.c
# Opt level: O0

void uss_mkdir(SftpServer *srv,SftpReplyBuilder *reply,ptrlen path,fxp_attrs attrs)

{
  int iVar1;
  char *__path;
  __mode_t local_58;
  int status;
  char *pathstr;
  UnixSftpServer *uss;
  SftpReplyBuilder *reply_local;
  SftpServer *srv_local;
  ptrlen path_local;
  
  __path = mkstr(path);
  if (((undefined1  [56])attrs & (undefined1  [56])0x4) == (undefined1  [56])0x0) {
    local_58 = 0x1ff;
  }
  else {
    local_58 = (__mode_t)attrs.permissions;
  }
  iVar1 = mkdir(__path,local_58);
  free(__path);
  if (iVar1 < 0) {
    uss_error((UnixSftpServer *)(srv + -6),reply);
  }
  else {
    fxp_reply_ok(reply);
  }
  return;
}

Assistant:

static void uss_mkdir(SftpServer *srv, SftpReplyBuilder *reply,
                      ptrlen path, struct fxp_attrs attrs)
{
    UnixSftpServer *uss = container_of(srv, UnixSftpServer, srv);

    char *pathstr = mkstr(path);
    int status = mkdir(pathstr, GET_PERMISSIONS(attrs, 0777));
    free(pathstr);

    if (status < 0) {
        uss_error(uss, reply);
    } else {
        fxp_reply_ok(reply);
    }
}